

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O1

SQInteger base_call_method_impl(HSQUIRRELVM v,bool safe)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType type;
  SQTable *pSVar2;
  SQTable *this;
  uint uVar3;
  SQObjectPtr SVar4;
  bool bVar5;
  uint uVar6;
  ulong uVar7;
  SQObjectPtr *pSVar8;
  long lVar9;
  SQRESULT SVar10;
  SQObject *pSVar11;
  SQChar *pSVar12;
  char *__format;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  sqvector<SQObjectPtr,_unsigned_int> args;
  bool t;
  SQObjectPtr ret;
  bool s;
  undefined1 uStack_464;
  undefined3 uStack_463;
  SQObjectValue SStack_460;
  undefined8 local_458;
  undefined4 local_450;
  SQObjectPtr callee;
  SQChar message [1024];
  
  memset(message,0,0x400);
  uVar7 = sq_gettop(v);
  uVar15 = (uint)uVar7;
  if ((int)uVar15 < 3) {
    if (!safe) {
      snprintf(message,0x400,
               "\'__call_method(...)\' recieves at least 2 arguments (%d), object to method on and method\'s name"
               ,uVar7 & 0xffffffff);
      goto LAB_00121c8a;
    }
    uVar7 = (ulong)(int)uVar15;
    goto LAB_00121c0f;
  }
  pSVar8 = SQVM::GetAt(v,v->_stackbase + 1);
  type = (pSVar8->super_SQObject)._type;
  local_458 = *(undefined8 *)&(pSVar8->super_SQObject)._flags;
  local_450 = *(undefined4 *)((long)&(pSVar8->super_SQObject)._unVal + 4);
  pSVar8 = SQVM::GetAt(v,v->_stackbase + 2);
  args._vals = *(SQObjectPtr **)&pSVar8->super_SQObject;
  if ((SQObjectType)args._vals == OT_STRING) {
    pSVar2 = (pSVar8->super_SQObject)._unVal.pTable;
    if ((int)type < 0x8000400) {
      if ((int)type < 0x8000010) {
        lVar9 = 0xe8;
        if (((type == OT_BOOL) || (type == OT_INTEGER)) || (type == OT_FLOAT)) goto LAB_00121d3b;
      }
      else if ((int)type < 0x8000100) {
        if (type == OT_STRING) {
          lVar9 = 0xd8;
          goto LAB_00121d3b;
        }
        if (type == OT_ARRAY) {
          lVar9 = 200;
          goto LAB_00121d3b;
        }
      }
      else if ((type == OT_CLOSURE) || (type == OT_NATIVECLOSURE)) {
        lVar9 = 0x108;
        goto LAB_00121d3b;
      }
    }
    else if ((int)type < 0x8010000) {
      if (type == OT_GENERATOR) {
        lVar9 = 0xf8;
LAB_00121d3b:
        this = *(SQTable **)((long)&v->_sharedstate->_alloc_ctx + lVar9);
        callee.super_SQObject._unVal.pTable = (SQTable *)0x0;
        callee.super_SQObject._type = OT_NULL;
        callee.super_SQObject._flags = '\0';
        callee.super_SQObject._5_3_ = 0;
        pSVar1 = &(pSVar2->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 + 1;
        args._alloc_ctx = (SQAllocContext)pSVar2;
        bVar5 = SQTable::Get(this,(SQObjectPtr *)&args,&callee);
        SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&args);
        if (bVar5) {
          args._alloc_ctx = v->_sharedstate->_alloc_ctx;
          args._vals = (SQObjectPtr *)0x0;
          args._size = 0;
          args._allocated = 0;
          uVar6 = uVar15 - 2;
          uVar13 = 4;
          if (uVar6 != 0) {
            uVar13 = (ulong)uVar6;
          }
          args._vals = (SQObjectPtr *)sq_vm_realloc(args._alloc_ctx,(void *)0x0,0,uVar13 << 4);
          args._allocated = (uint)uVar13;
          ret.super_SQObject._4_8_ = local_458;
          ret.super_SQObject._type = type;
          ret.super_SQObject._unVal.nInteger._4_4_ = local_450;
          if ((type >> 0x1b & 1) != 0) {
            pSVar1 = &((ret.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                      super_SQRefCounted._uiRef;
            *pSVar1 = *pSVar1 + 1;
          }
          if ((uint)uVar13 <= args._size) {
            uVar14 = 4;
            if (args._size * 2 != 0) {
              uVar14 = (ulong)(args._size * 2);
            }
            args._vals = (SQObjectPtr *)
                         sq_vm_realloc(args._alloc_ctx,args._vals,uVar13 << 4,uVar14 << 4);
            args._allocated = (size_type)uVar14;
          }
          SVar4.super_SQObject = ret.super_SQObject;
          uVar13 = args._16_8_ & 0xffffffff;
          args._size = args._size + 1;
          pSVar8 = args._vals + uVar13;
          (pSVar8->super_SQObject)._type = ret.super_SQObject._type;
          (pSVar8->super_SQObject)._flags = ret.super_SQObject._flags;
          *(undefined3 *)&(pSVar8->super_SQObject).field_0x5 = ret.super_SQObject._5_3_;
          (pSVar8->super_SQObject)._unVal = ret.super_SQObject._unVal;
          if ((args._vals[uVar13].super_SQObject._type & 0x8000000) != 0) {
            pSVar1 = &((args._vals[uVar13].super_SQObject._unVal.pTable)->super_SQDelegable).
                      super_SQCollectable.super_SQRefCounted._uiRef;
            *pSVar1 = *pSVar1 + 1;
          }
          ret.super_SQObject = SVar4.super_SQObject;
          SQObjectPtr::~SQObjectPtr(&ret);
          if (uVar15 != 3) {
            uVar7 = uVar7 & 0xffffffff;
            if ((int)uVar15 < 5) {
              uVar7 = 4;
            }
            uVar13 = 3;
            do {
              pSVar11 = &SQVM::GetAt(v,v->_stackbase + uVar13)->super_SQObject;
              _s = pSVar11->_type;
              uStack_464 = pSVar11->_flags;
              uStack_463 = *(undefined3 *)&pSVar11->field_0x5;
              SStack_460 = (SQObjectValue)(pSVar11->_unVal).pTable;
              ret.super_SQObject = *pSVar11;
              if ((_s & 0x8000000) != 0) {
                pSVar1 = &((SStack_460.pTable)->super_SQDelegable).super_SQCollectable.
                          super_SQRefCounted._uiRef;
                *pSVar1 = *pSVar1 + 1;
              }
              if (args._allocated <= args._size) {
                uVar3 = args._size * 2;
                if (args._size * 2 == 0) {
                  uVar3 = 4;
                }
                args._vals = (SQObjectPtr *)
                             sq_vm_realloc(args._alloc_ctx,args._vals,(ulong)args._allocated << 4,
                                           (ulong)uVar3 << 4);
                args._allocated = uVar3;
              }
              uVar14 = args._16_8_ & 0xffffffff;
              args._size = args._size + 1;
              pSVar8 = args._vals + uVar14;
              (pSVar8->super_SQObject)._type = _s;
              (pSVar8->super_SQObject)._flags = uStack_464;
              *(undefined3 *)&(pSVar8->super_SQObject).field_0x5 = uStack_463;
              (pSVar8->super_SQObject)._unVal.pTable = (SQTable *)SStack_460;
              if ((args._vals[uVar14].super_SQObject._type & 0x8000000) != 0) {
                pSVar1 = &((args._vals[uVar14].super_SQObject._unVal.pTable)->super_SQDelegable).
                          super_SQCollectable.super_SQRefCounted._uiRef;
                *pSVar1 = *pSVar1 + 1;
              }
              SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&s);
              uVar13 = uVar13 + 1;
            } while (uVar7 != uVar13);
          }
          if (args._size != 0) {
            lVar9 = 0;
            uVar7 = 0;
            do {
              SQVM::Push(v,(SQObjectPtr *)((long)&((args._vals)->super_SQObject)._type + lVar9));
              uVar7 = uVar7 + 1;
              lVar9 = lVar9 + 0x10;
            } while (uVar7 < (args._16_8_ & 0xffffffff));
          }
          ret.super_SQObject._4_12_ = SUB1612((undefined1  [16])0x0,4);
          ret.super_SQObject._type = OT_NULL;
          bVar5 = SQVM::CallNative(v,callee.super_SQObject._unVal.pNativeClosure,(ulong)uVar6,
                                   v->_stackbase + (ulong)(uVar15 & 0x7fffffff),&ret,-1,&s,&t);
          SVar10 = -1;
          if (bVar5) {
            SQVM::Pop(v,(ulong)(uVar15 & 0x7fffffff));
            SVar10 = 1;
            SQVM::Push(v,&ret);
          }
          SQObjectPtr::~SQObjectPtr(&ret);
          sqvector<SQObjectPtr,_unsigned_int>::_releasedata(&args);
        }
        else if (safe) {
          SQVM::Pop(v,(ulong)(uVar15 & 0x7fffffff));
          SVar10 = 1;
          SQVM::PushNull(v);
        }
        else {
          pSVar12 = IdType2Name(type);
          snprintf(message,0x400,"function \'%s\' not found in \'%s\' delegates",&pSVar2->_firstfree
                   ,pSVar12);
          SVar10 = sq_throwerror(v,message);
        }
        SQObjectPtr::~SQObjectPtr(&callee);
        return SVar10;
      }
      if (type == OT_THREAD) {
        lVar9 = 0x118;
        goto LAB_00121d3b;
      }
      if (type == OT_CLASS) {
        lVar9 = 0x128;
        goto LAB_00121d3b;
      }
    }
    else if ((int)type < 0xa000080) {
      if (type == OT_WEAKREF) {
        lVar9 = 0x148;
        goto LAB_00121d3b;
      }
      if (type == OT_TABLE) {
        lVar9 = 0xb8;
        goto LAB_00121d3b;
      }
    }
    else {
      if (type == OT_USERDATA) {
        lVar9 = 0x158;
        goto LAB_00121d3b;
      }
      if (type == OT_INSTANCE) {
        lVar9 = 0x138;
        goto LAB_00121d3b;
      }
    }
    if (!safe) {
      pSVar12 = IdType2Name(type);
      __format = "unsupported object type \'%s\' as receiver in \'__call_method(...)\' function";
      goto LAB_00121c6d;
    }
  }
  else if (!safe) {
    pSVar12 = IdType2Name((SQObjectType)args._vals);
    __format = "\'__call_method(...)\' expects 2nd argument to be string, actual \'%s\'";
LAB_00121c6d:
    snprintf(message,0x400,__format,pSVar12);
LAB_00121c8a:
    SVar10 = sq_throwerror(v,message);
    return SVar10;
  }
  uVar7 = (ulong)(uVar15 & 0x7fffffff);
LAB_00121c0f:
  SQVM::Pop(v,uVar7);
  SQVM::PushNull(v);
  return 1;
}

Assistant:

static SQInteger base_call_method_impl(HSQUIRRELVM v, bool safe)
{
    SQChar message[1024] = {0};
    int32_t nArgs = sq_gettop(v);

    if (nArgs < 3)
    {
        if (safe)
        {
            v->Pop(nArgs);
            v->PushNull();
            return 1;
        }
        snprintf(message, sizeof message, _SC("'__call_method(...)' recieves at least 2 arguments (%d), object to method on and method's name"), nArgs);
        return sq_throwerror(v, message);
    }

    SQObject obj = stack_get(v, 2);
    SQObject name = stack_get(v, 3);

    if (!sq_isstring(name))
    {
        if (safe)
        {
            v->Pop(nArgs);
            v->PushNull();
            return 1;
        }
        snprintf(message, sizeof message, _SC("'__call_method(...)' expects 2nd argument to be string, actual '%s'"), IdType2Name(sq_type(name)));
        return sq_throwerror(v, message);
    }

    SQObject delegates;
    SQObjectType type = sq_type(obj);
    switch (type)
    {
    case OT_INTEGER:
    case OT_FLOAT:
    case OT_BOOL:
        delegates = _ss(v)->_number_default_delegate;
        break;
    case OT_STRING:
        delegates = _ss(v)->_string_default_delegate;
        break;
    case OT_TABLE:
        delegates = _ss(v)->_table_default_delegate;
        break;
    case OT_ARRAY:
        delegates = _ss(v)->_array_default_delegate;
        break;
    case OT_USERDATA:
        delegates = _ss(v)->_userdata_default_delegate;
        break;
    case OT_CLOSURE:
    case OT_NATIVECLOSURE:
        delegates = _ss(v)->_closure_default_delegate;
        break;
    case OT_GENERATOR:
        delegates = _ss(v)->_generator_default_delegate;
        break;
    case OT_THREAD:
        delegates = _ss(v)->_thread_default_delegate;
        break;
    case OT_CLASS:
        delegates = _ss(v)->_class_default_delegate;
        break;
    case OT_INSTANCE:
        delegates = _ss(v)->_instance_default_delegate;
        break;
    case OT_WEAKREF:
        delegates = _ss(v)->_weakref_default_delegate;
        break;
    default:
        if (safe)
        {
            v->Pop(nArgs);
            v->PushNull();
            return 1;
        }
        snprintf(message, sizeof message, _SC("unsupported object type '%s' as receiver in '__call_method(...)' function"), IdType2Name(type));
        return sq_throwerror(v, message);
    }

    assert(sq_istable(delegates));

    SQObjectPtr callee;
    if (!_table(delegates)->Get(name, callee))
    {
        if (safe)
        {
            v->Pop(nArgs);
            v->PushNull();
            return 1;
        }
        else
        {
            snprintf(message, sizeof message, _SC("function '%s' not found in '%s' delegates"), _stringval(name), IdType2Name(type));
            return sq_throwerror(v, message);
        }
    }

    assert(sq_isnativeclosure(callee));

    sqvector<SQObjectPtr> args(_ss(v)->_alloc_ctx);

    args.reserve(nArgs - 2);
    args.push_back(obj);

    for (int32_t i = 4; i <= nArgs; ++i) // skip reciever + name
    {
        SQObject arg = stack_get(v, i);
        args.push_back(arg);
    }

    for (int32_t i = 0; i < args.size(); ++i)
    {
        v->Push(args[i]);
    }

    bool s, t;
    SQObjectPtr ret;
    if (!v->CallNative(_nativeclosure(callee), nArgs - 2, v->_stackbase + nArgs, ret, -1, s, t))
    {
        return SQ_ERROR;
    }

    v->Pop(nArgs);
    v->Push(ret);
    return 1;
}